

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

void Internal_DimStyleMillimeterArchitecturalInit(ON_DimStyle *ds)

{
  ON_DimStyle *ds_local;
  
  Internal_DimStyleDefaultInit(ds);
  ON_DimStyle::SetExtExtension(ds,1.0);
  ON_DimStyle::SetArrowSize(ds,3.0);
  ON_DimStyle::SetLeaderArrowSize(ds,3.0);
  ON_DimStyle::SetCenterMark(ds,3.0);
  ON_DimStyle::SetTextGap(ds,1.0);
  ON_DimStyle::SetTextHeight(ds,3.0);
  ON_DimStyle::SetAngleResolution(ds,0);
  ON_DimStyle::SetDimensionLengthDisplay(ds,Millmeters);
  ON_DimStyle::SetAlternateDimensionLengthDisplay(ds,InchesDecimal);
  ON_DimStyle::SetLengthResolution(ds,0);
  ON_DimStyle::SetBaselineSpacing(ds,9.0);
  ON_DimStyle::SetArrowType1(ds,Tick);
  ON_DimStyle::SetArrowType2(ds,Tick);
  ON_DimStyle::SetLeaderArrowType(ds,OpenArrow);
  ON_DimStyle::SetDimScale(ds,100.0);
  ON_DimStyle::SetUnitSystem(ds,Millimeters);
  return;
}

Assistant:

static void Internal_DimStyleMillimeterArchitecturalInit(ON_DimStyle& ds)
{
  Internal_DimStyleDefaultInit(ds);
  ds.SetExtExtension                     (1.0);
  ds.SetArrowSize                        (3.0);
  ds.SetLeaderArrowSize                  (3.0);
  ds.SetCenterMark                       (3.0);
  ds.SetTextGap                          (1.0);
  ds.SetTextHeight                       (3.0);
  ds.SetAngleResolution                  (0);
  ds.SetDimensionLengthDisplay           (ON_DimStyle::LengthDisplay::Millmeters);
  ds.SetAlternateDimensionLengthDisplay  (ON_DimStyle::LengthDisplay::InchesDecimal);
  ds.SetLengthResolution                 (0);
  ds.SetBaselineSpacing                  (9.0);
  ds.SetArrowType1                       (ON_Arrowhead::arrow_type::Tick);
  ds.SetArrowType2                       (ON_Arrowhead::arrow_type::Tick);
  ds.SetLeaderArrowType                  (ON_Arrowhead::arrow_type::OpenArrow);
  ds.SetDimScale                         (100.0);
  ds.SetUnitSystem                       (ON::LengthUnitSystem::Millimeters);
}